

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

int xmlXPathHasSameNodes(xmlNodeSetPtr nodes1,xmlNodeSetPtr nodes2)

{
  int iVar1;
  xmlNodePtr local_40;
  int local_34;
  xmlNodePtr cur;
  int l;
  int i;
  xmlNodeSetPtr nodes2_local;
  xmlNodeSetPtr nodes1_local;
  
  if (((((nodes1 != (xmlNodeSetPtr)0x0) && (nodes1->nodeNr != 0)) &&
       (nodes1->nodeTab != (xmlNodePtr *)0x0)) &&
      ((nodes2 != (xmlNodeSetPtr)0x0 && (nodes2->nodeNr != 0)))) &&
     (nodes2->nodeTab != (xmlNodePtr *)0x0)) {
    if (nodes1 == (xmlNodeSetPtr)0x0) {
      local_34 = 0;
    }
    else {
      local_34 = nodes1->nodeNr;
    }
    for (cur._4_4_ = 0; cur._4_4_ < local_34; cur._4_4_ = cur._4_4_ + 1) {
      if (((nodes1 == (xmlNodeSetPtr)0x0) || (cur._4_4_ < 0)) || (nodes1->nodeNr <= cur._4_4_)) {
        local_40 = (xmlNodePtr)0x0;
      }
      else {
        local_40 = nodes1->nodeTab[cur._4_4_];
      }
      iVar1 = xmlXPathNodeSetContains(nodes2,local_40);
      if (iVar1 != 0) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

int
xmlXPathHasSameNodes (xmlNodeSetPtr nodes1, xmlNodeSetPtr nodes2) {
    int i, l;
    xmlNodePtr cur;

    if (xmlXPathNodeSetIsEmpty(nodes1) ||
	xmlXPathNodeSetIsEmpty(nodes2))
	return(0);

    l = xmlXPathNodeSetGetLength(nodes1);
    for (i = 0; i < l; i++) {
	cur = xmlXPathNodeSetItem(nodes1, i);
	if (xmlXPathNodeSetContains(nodes2, cur))
	    return(1);
    }
    return(0);
}